

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O2

void xmlCtxtCheckName(xmlDebugCtxtPtr ctxt,xmlChar *name)

{
  int iVar1;
  
  if (ctxt->check != 0) {
    if (name == (xmlChar *)0x0) {
      xmlDebugErr(ctxt,0x1397,"Name is NULL");
      return;
    }
    iVar1 = xmlValidateName(name,0);
    if (iVar1 != 0) {
      xmlDebugErr3(ctxt,0x13aa,"Name is not an NCName \'%s\'",(char *)name);
    }
    if (ctxt->dict != (xmlDictPtr)0x0) {
      iVar1 = xmlDictOwns(ctxt->dict,name);
      if ((iVar1 == 0) && ((ctxt->doc == (xmlDocPtr)0x0 || ((ctxt->doc->parseFlags & 0x1200) == 0)))
         ) {
        xmlDebugErr3(ctxt,0x13ab,"Name is not from the document dictionary \'%s\'",(char *)name);
        return;
      }
    }
  }
  return;
}

Assistant:

static void
xmlCtxtCheckName(xmlDebugCtxtPtr ctxt, const xmlChar * name)
{
    if (ctxt->check) {
	if (name == NULL) {
	    xmlDebugErr(ctxt, XML_CHECK_NO_NAME, "Name is NULL");
	    return;
	}
#if defined(LIBXML_TREE_ENABLED) || defined(LIBXML_SCHEMAS_ENABLED)
        if (xmlValidateName(name, 0)) {
	    xmlDebugErr3(ctxt, XML_CHECK_NOT_NCNAME,
			 "Name is not an NCName '%s'", (const char *) name);
	}
#endif
	if ((ctxt->dict != NULL) &&
	    (!xmlDictOwns(ctxt->dict, name)) &&
            ((ctxt->doc == NULL) ||
             ((ctxt->doc->parseFlags & (XML_PARSE_SAX1 | XML_PARSE_NODICT)) == 0))) {
	    xmlDebugErr3(ctxt, XML_CHECK_OUTSIDE_DICT,
			 "Name is not from the document dictionary '%s'",
			 (const char *) name);
	}
    }
}